

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::CWallet::Create
          (CWallet *this,WalletContext *context,string *name,
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database,
          uint64_t wallet_creation_flags,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  ArgsManager *this_00;
  Handler *pHVar1;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bilingual_str lhs_01;
  bilingual_str lhs_02;
  bilingual_str lhs_03;
  bilingual_str lhs_04;
  bilingual_str lhs_05;
  bilingual_str lhs_06;
  bilingual_str lhs_07;
  bilingual_str lhs_08;
  bilingual_str lhs_09;
  bilingual_str lhs_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  size_type sVar3;
  char cVar4;
  bool bVar5;
  DBErrors DVar6;
  int iVar7;
  uint uVar8;
  ArgsManager **ppAVar9;
  long lVar10;
  CWallet *pCVar11;
  int64_t iVar12;
  optional<OutputType> oVar13;
  _Storage<long,_true> _Var14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64_t iVar15;
  long lVar16;
  element_type *peVar17;
  undefined8 uVar18;
  uint *args;
  string *psVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *args_1;
  undefined4 uVar20;
  element_type *peVar21;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar22;
  optional<long> oVar23;
  undefined8 in_stack_fffffffffffffa58;
  bilingual_str *this_01;
  undefined1 rescan_required;
  Chain *chain;
  Chain *chain_00;
  undefined4 in_stack_fffffffffffffa88;
  FeeEstimateMode in_stack_fffffffffffffa8c;
  CFeeRate in_stack_fffffffffffffa90;
  allocator<char> local_562;
  allocator<char> local_561;
  long *local_560;
  shared_ptr<wallet::CWallet> walletInstance;
  optional<long> pay_tx_fee;
  string local_538 [32];
  bilingual_str local_518;
  bilingual_str local_4d8;
  string local_498;
  string local_478 [32];
  bilingual_str local_458;
  bilingual_str local_418;
  string local_3d8 [32];
  bilingual_str local_3b8;
  bilingual_str local_378;
  string local_338 [32];
  bilingual_str local_318;
  bilingual_str local_2d8;
  string local_298 [32];
  bilingual_str local_278;
  bilingual_str local_238;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  undefined8 local_1e0;
  string local_1b8 [32];
  bilingual_str local_198;
  bilingual_str local_158;
  string local_118;
  string max_aps_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  undefined8 local_c0;
  bilingual_str local_98;
  string local_58 [32];
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  chain = context->chain;
  args_1 = "context.args";
  this_01 = error;
  ppAVar9 = inline_assertion_check<true,ArgsManager*&>
                      (&context->args,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                       ,0xb9f,"Create","context.args");
  this_00 = *ppAVar9;
  (**(code **)(**(long **)database._M_t.
                          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
              0x60))(local_58);
  lVar10 = std::chrono::_V2::steady_clock::now();
  pCVar11 = (CWallet *)operator_new(0x4a8);
  local_560 = *(long **)database._M_t.
                        super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                        .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  *(undefined8 *)
   database._M_t.
   super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t.
   super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
   super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = 0;
  CWallet(pCVar11,chain,name,
          (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
          &local_560);
  std::__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<wallet::CWallet,void(*)(wallet::CWallet*),void>
            ((__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2> *)&walletInstance,pCVar11,
             FlushAndDeleteWallet);
  if (local_560 != (long *)0x0) {
    (**(code **)(*local_560 + 8))();
  }
  local_560 = (long *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"-keypool",(allocator<char> *)&criticalblock59);
  chain_00 = chain;
  iVar12 = ArgsManager::GetIntArg(this_00,&local_98.original,1000);
  iVar15 = 1;
  if (1 < iVar12) {
    iVar15 = iVar12;
  }
  (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_keypool_size = iVar15;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&criticalblock59,"-walletnotify",(allocator<char> *)&max_aps_fee);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
  ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                      (string *)&criticalblock58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->m_notify_tx_changed_script,&local_98.original);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&criticalblock58);
  std::__cxx11::string::~string((string *)&criticalblock59);
  DVar6 = LoadWallet(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar20 = 0;
  args = &switchD_0098ca59::switchdataD_00e05908;
  switch(DVar6) {
  case LOAD_OK:
    goto switchD_0098ca59_caseD_0;
  case NEED_RESCAN:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe07372);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,&local_98);
    bilingual_str::~bilingual_str(&local_98);
    bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
    uVar20 = 1;
    goto switchD_0098ca59_caseD_0;
  case NEED_REWRITE:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe0733c);
    tinyformat::format<char[13]>
              (&local_98,(bilingual_str *)&criticalblock59,(char (*) [13])"Bitcoin Core");
    break;
  case EXTERNAL_SIGNER_SUPPORT_REQUIRED:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe072dd);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  case NONCRITICAL_ERROR:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe07236);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,&local_98);
    bilingual_str::~bilingual_str(&local_98);
    bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
    uVar20 = 0;
switchD_0098ca59_caseD_0:
    if (((((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
        ((((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x100000000) == 0)) &&
       (args = (uint *)0x200000000,
       (((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x200000000) == 0)) {
      SetMinVersion(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,FEATURE_LATEST,(WalletBatch *)0x0);
      InitWalletFlags(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,wallet_creation_flags);
      if ((((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
        SetupLegacyScriptPubKeyMan
                  (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if ((wallet_creation_flags & 0x800000000) != 0 || (wallet_creation_flags & 0x300000000) == 0)
      {
        args_1 = (char *)0xbe7;
        error = (bilingual_str *)0x0;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock58,
                   &(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->cs_wallet,"walletInstance->cs_wallet",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                   ,0xbe7,false);
        if ((((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x400000000) == 0) {
          GetActiveScriptPubKeyMans
                    ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                      *)&criticalblock59,
                     walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          for (; (bool *)local_c0 != &criticalblock59.super_unique_lock._M_owns;
              local_c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_c0)) {
            cVar4 = (**(code **)(**(long **)(local_c0 + 0x20) + 0x58))
                              (*(long **)(local_c0 + 0x20),0);
            if (cVar4 == '\0') {
              _(&local_98,(ConstevalStringLiteral)0xe06214);
              bilingual_str::operator=(this_01,&local_98);
              bilingual_str::~bilingual_str(&local_98);
              (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
              (this->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
              std::
              _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                           *)&criticalblock59);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        (&criticalblock58.super_unique_lock);
              goto LAB_0098cdb5;
            }
          }
          std::
          _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                       *)&criticalblock59);
        }
        else {
          SetupDescriptorScriptPubKeyMans
                    (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock58.super_unique_lock);
      }
      peVar21 = walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (chain != (Chain *)0x0) {
        (*chain->_vptr_Chain[5])(&local_98);
        chainStateFlushed(peVar21,NORMAL,(CBlockLocator *)&local_98);
        std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                  ((_Vector_base<uint256,_std::allocator<uint256>_> *)&local_98);
      }
    }
    else {
      if ((wallet_creation_flags & 0x100000000) != 0) {
        _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe0751c);
        tinyformat::format<std::__cxx11::string>
                  (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        break;
      }
      if ((((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x100000000) != 0) {
        GetActiveScriptPubKeyMans
                  ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                    *)&criticalblock58,
                   walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        for (; (bool *)local_1e0 != &criticalblock58.super_unique_lock._M_owns;
            local_1e0 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_1e0)) {
          cVar4 = (**(code **)(**(long **)(local_1e0 + 0x20) + 0x78))();
          if (cVar4 != '\0') {
            _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe07560);
            tinyformat::format<std::__cxx11::string>
                      (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,&local_98);
            bilingual_str::~bilingual_str(&local_98);
            bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
            break;
          }
        }
        std::
        _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                     *)&criticalblock58);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock59,"-addresstype",(allocator<char> *)&max_aps_fee);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
    ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                        (string *)&criticalblock58);
    sVar3 = local_98.original._M_string_length;
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&criticalblock58);
    std::__cxx11::string::~string((string *)&criticalblock59);
    if (sVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock59,"-addresstype",(allocator<char> *)&max_aps_fee);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
      ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                          (string *)&criticalblock58);
      oVar13 = ParseOutputType(&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&criticalblock58);
      std::__cxx11::string::~string((string *)&criticalblock59);
      if (((ulong)oVar13.super__Optional_base<OutputType,_true,_true>._M_payload.
                  super__Optional_payload_base<OutputType> & 0x100000000) != 0) {
        (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_default_address_type =
             oVar13.super__Optional_base<OutputType,_true,_true>._M_payload.
             super__Optional_payload_base<OutputType>._M_payload;
        goto LAB_0098d02c;
      }
      _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xcc91a9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&max_aps_fee,"-addresstype",(allocator<char> *)&local_498);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"",(allocator<char> *)&pay_tx_fee);
      psVar19 = &local_118;
      ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,psVar19);
      tinyformat::format<std::__cxx11::string>
                (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)&criticalblock58,psVar19)
      ;
LAB_0098e2d4:
      bilingual_str::operator=(this_01,&local_98);
      bilingual_str::~bilingual_str(&local_98);
LAB_0098e2f1:
      std::__cxx11::string::~string((string *)&criticalblock58);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&max_aps_fee);
      goto LAB_0098cd9d;
    }
LAB_0098d02c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock59,"-changetype",(allocator<char> *)&max_aps_fee);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
    ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                        (string *)&criticalblock58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&criticalblock58);
    std::__cxx11::string::~string((string *)&criticalblock59);
    if (local_98.original._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock59,"-changetype",(allocator<char> *)&max_aps_fee);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
      ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                          (string *)&criticalblock58);
      oVar13 = ParseOutputType(&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&criticalblock58);
      std::__cxx11::string::~string((string *)&criticalblock59);
      if (((ulong)oVar13.super__Optional_base<OutputType,_true,_true>._M_payload.
                  super__Optional_payload_base<OutputType> & 0x100000000) == 0) {
        _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe075a9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&max_aps_fee,"-changetype",(allocator<char> *)&local_498);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"",(allocator<char> *)&pay_tx_fee);
        psVar19 = &local_118;
        ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,psVar19);
        tinyformat::format<std::__cxx11::string>
                  (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)&criticalblock58,
                   psVar19);
        goto LAB_0098e2d4;
      }
      ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_default_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
      super__Optional_payload_base<OutputType> =
           (_Optional_payload_base<OutputType>)
           ((ulong)oVar13.super__Optional_base<OutputType,_true,_true>._M_payload.
                   super__Optional_payload_base<OutputType> & 0x1ffffffff);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"-mintxfee",(allocator<char> *)&criticalblock59);
    bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
    std::__cxx11::string::~string((string *)&local_98);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock59,"-mintxfee",(allocator<char> *)&max_aps_fee);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
      ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                          (string *)&criticalblock58);
      oVar23 = ParseMoney(&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&criticalblock58);
      std::__cxx11::string::~string((string *)&criticalblock59);
      if (((undefined1  [16])
           oVar23.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (1000000 < oVar23.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-mintxfee",(allocator<char> *)&local_118);
          common::AmountHighWarn(&local_198,&max_aps_fee);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1b8," ",(allocator<char> *)&local_498);
          original._M_string_length = (size_type)this_01;
          original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          original.field_2._M_allocated_capacity = (size_type)this;
          original.field_2._8_4_ = (int)wallet_creation_flags;
          original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          Untranslated((bilingual_str *)&criticalblock59,original);
          lhs.original._M_string_length = (size_type)this_01;
          lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          lhs.original.field_2._M_allocated_capacity = (size_type)this;
          lhs.original.field_2._8_4_ = (int)wallet_creation_flags;
          lhs.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          lhs.translated._M_dataplus._M_p = (pointer)chain_00;
          lhs.translated._M_string_length = lVar10;
          lhs.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
          lhs.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
          lhs.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
          ::operator+(&local_158,lhs,&local_198);
          _((bilingual_str *)&criticalblock58,(ConstevalStringLiteral)0xe075cc);
          lhs_00.original._M_string_length = (size_type)this_01;
          lhs_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          lhs_00.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_00.original.field_2._8_4_ = (int)wallet_creation_flags;
          lhs_00.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          lhs_00.translated._M_dataplus._M_p = (pointer)chain_00;
          lhs_00.translated._M_string_length = lVar10;
          lhs_00.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
          lhs_00.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
          lhs_00.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
          ::operator+(&local_98,lhs_00,&local_158);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock58);
          bilingual_str::~bilingual_str(&local_158);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
          std::__cxx11::string::~string(local_1b8);
          bilingual_str::~bilingual_str(&local_198);
          std::__cxx11::string::~string((string *)&max_aps_fee);
        }
        ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_min_fee).nSatoshisPerK =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        goto LAB_0098d400;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock59,"mintxfee",(allocator<char> *)&local_498);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&max_aps_fee,"-mintxfee",(allocator<char> *)&pay_tx_fee);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"",(allocator<char> *)&stack0xfffffffffffffa90);
      ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
      common::AmountErrMsg(&local_98,(string *)&criticalblock59,(string *)&criticalblock58);
LAB_0098ea65:
      bilingual_str::operator=(this_01,&local_98);
      bilingual_str::~bilingual_str(&local_98);
      std::__cxx11::string::~string((string *)&criticalblock58);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&max_aps_fee);
      std::__cxx11::string::~string((string *)&criticalblock59);
      goto LAB_0098cdb2;
    }
LAB_0098d400:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"-maxapsfee",(allocator<char> *)&criticalblock59);
    bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
    std::__cxx11::string::~string((string *)&local_98);
    if (!bVar5) {
LAB_0098d4ed:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-fallbackfee",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock59,"-fallbackfee",(allocator<char> *)&max_aps_fee);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
        ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                            (string *)&criticalblock58);
        oVar23 = ParseMoney(&local_98.original);
        _Var14._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&criticalblock58);
        std::__cxx11::string::~string((string *)&criticalblock59);
        if (((undefined1  [16])
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe076a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-fallbackfee",(allocator<char> *)&local_498);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"",(allocator<char> *)&pay_tx_fee);
          ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
          tinyformat::format<char[13],std::__cxx11::string>
                    (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)"-fallbackfee",
                     (char (*) [13])&criticalblock58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          goto LAB_0098e2d4;
        }
        if (1000000 < _Var14._M_value) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-fallbackfee",(allocator<char> *)&local_118);
          common::AmountHighWarn(&local_318,&max_aps_fee);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_338," ",(allocator<char> *)&local_498);
          original_00._M_string_length = (size_type)this_01;
          original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          original_00.field_2._M_allocated_capacity = (size_type)this;
          original_00.field_2._8_4_ = (int)wallet_creation_flags;
          original_00.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          Untranslated((bilingual_str *)&criticalblock59,original_00);
          lhs_01.original._M_string_length = (size_type)this_01;
          lhs_01.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          lhs_01.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_01.original.field_2._8_4_ = (int)wallet_creation_flags;
          lhs_01.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          lhs_01.translated._M_dataplus._M_p = (pointer)chain_00;
          lhs_01.translated._M_string_length = lVar10;
          lhs_01.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
          lhs_01.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
          lhs_01.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
          ::operator+(&local_2d8,lhs_01,&local_318);
          _((bilingual_str *)&criticalblock58,(ConstevalStringLiteral)0xe076cd);
          lhs_02.original._M_string_length = (size_type)this_01;
          lhs_02.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          lhs_02.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_02.original.field_2._8_4_ = (int)wallet_creation_flags;
          lhs_02.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          lhs_02.translated._M_dataplus._M_p = (pointer)chain_00;
          lhs_02.translated._M_string_length = lVar10;
          lhs_02.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
          lhs_02.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
          lhs_02.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
          ::operator+(&local_98,lhs_02,&local_2d8);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock58);
          bilingual_str::~bilingual_str(&local_2d8);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
          std::__cxx11::string::~string(local_338);
          bilingual_str::~bilingual_str(&local_318);
          std::__cxx11::string::~string((string *)&max_aps_fee);
        }
        ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_fallback_fee).nSatoshisPerK = (CAmount)_Var14;
      }
      else {
        _Var14 = (_Storage<long,_true>)
                 ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_fallback_fee).nSatoshisPerK;
      }
      (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_allow_fallback_fee = _Var14._M_value != 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-discardfee",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock59,"-discardfee",(allocator<char> *)&max_aps_fee);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
        ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                            (string *)&criticalblock58);
        oVar23 = ParseMoney(&local_98.original);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&criticalblock58);
        std::__cxx11::string::~string((string *)&criticalblock59);
        if (((undefined1  [16])
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe076a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-discardfee",(allocator<char> *)&local_498);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"",(allocator<char> *)&pay_tx_fee);
          ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
          tinyformat::format<char[12],std::__cxx11::string>
                    (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)"-discardfee",
                     (char (*) [12])&criticalblock58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          goto LAB_0098e2d4;
        }
        if (1000000 < oVar23.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-discardfee",(allocator<char> *)&local_118);
          common::AmountHighWarn(&local_3b8,&max_aps_fee);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_3d8," ",(allocator<char> *)&local_498);
          original_01._M_string_length = (size_type)this_01;
          original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          original_01.field_2._M_allocated_capacity = (size_type)this;
          original_01.field_2._8_4_ = (int)wallet_creation_flags;
          original_01.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          Untranslated((bilingual_str *)&criticalblock59,original_01);
          lhs_03.original._M_string_length = (size_type)this_01;
          lhs_03.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          lhs_03.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_03.original.field_2._8_4_ = (int)wallet_creation_flags;
          lhs_03.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          lhs_03.translated._M_dataplus._M_p = (pointer)chain_00;
          lhs_03.translated._M_string_length = lVar10;
          lhs_03.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
          lhs_03.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
          lhs_03.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
          ::operator+(&local_378,lhs_03,&local_3b8);
          _((bilingual_str *)&criticalblock58,(ConstevalStringLiteral)0xe07727);
          lhs_04.original._M_string_length = (size_type)this_01;
          lhs_04.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
          lhs_04.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_04.original.field_2._8_4_ = (int)wallet_creation_flags;
          lhs_04.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
          lhs_04.translated._M_dataplus._M_p = (pointer)chain_00;
          lhs_04.translated._M_string_length = lVar10;
          lhs_04.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
          lhs_04.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
          lhs_04.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
          ::operator+(&local_98,lhs_04,&local_378);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock58);
          bilingual_str::~bilingual_str(&local_378);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
          std::__cxx11::string::~string(local_3d8);
          bilingual_str::~bilingual_str(&local_3b8);
          std::__cxx11::string::~string((string *)&max_aps_fee);
        }
        ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_discard_rate).nSatoshisPerK =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-paytxfee",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock59,"-paytxfee",(allocator<char> *)&max_aps_fee);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
        ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                            (string *)&criticalblock58);
        oVar23 = ParseMoney(&local_98.original);
        pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&criticalblock58);
        std::__cxx11::string::~string((string *)&criticalblock59);
        if (pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged != false) {
          if (1000000 < pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_payload._M_value) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&max_aps_fee,"-paytxfee",(allocator<char> *)&local_118);
            common::AmountHighWarn(&local_458,&max_aps_fee);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478," ",(allocator<char> *)&local_498);
            original_02._M_string_length = (size_type)this_01;
            original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
            original_02.field_2._M_allocated_capacity = (size_type)this;
            original_02.field_2._8_4_ = (int)wallet_creation_flags;
            original_02.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
            Untranslated((bilingual_str *)&criticalblock59,original_02);
            lhs_05.original._M_string_length = (size_type)this_01;
            lhs_05.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
            lhs_05.original.field_2._M_allocated_capacity = (size_type)this;
            lhs_05.original.field_2._8_4_ = (int)wallet_creation_flags;
            lhs_05.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
            lhs_05.translated._M_dataplus._M_p = (pointer)chain_00;
            lhs_05.translated._M_string_length = lVar10;
            lhs_05.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
            lhs_05.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
            lhs_05.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
            ::operator+(&local_418,lhs_05,&local_458);
            _((bilingual_str *)&criticalblock58,(ConstevalStringLiteral)0xe0778a);
            lhs_06.original._M_string_length = (size_type)this_01;
            lhs_06.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
            lhs_06.original.field_2._M_allocated_capacity = (size_type)this;
            lhs_06.original.field_2._8_4_ = (int)wallet_creation_flags;
            lhs_06.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
            lhs_06.translated._M_dataplus._M_p = (pointer)chain_00;
            lhs_06.translated._M_string_length = lVar10;
            lhs_06.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
            lhs_06.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
            lhs_06.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
            ::operator+(&local_98,lhs_06,&local_418);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,&local_98);
            bilingual_str::~bilingual_str(&local_98);
            bilingual_str::~bilingual_str((bilingual_str *)&criticalblock58);
            bilingual_str::~bilingual_str(&local_418);
            bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
            std::__cxx11::string::~string(local_478);
            bilingual_str::~bilingual_str(&local_458);
            std::__cxx11::string::~string((string *)&max_aps_fee);
          }
          if ((pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged & 1U) == 0) {
            if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
              std::__throw_bad_optional_access();
            }
            goto LAB_0098f727;
          }
          CFeeRate::CFeeRate((CFeeRate *)&local_98,(CAmount *)&pay_tx_fee,1000);
          peVar21 = walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_pay_tx_fee).nSatoshisPerK = (CAmount)local_98.original._M_dataplus._M_p;
          if ((chain == (Chain *)0x0) ||
             (iVar7 = (*chain->_vptr_Chain[0x1e])(chain),
             CONCAT44(extraout_var,iVar7) <= (peVar21->m_pay_tx_fee).nSatoshisPerK))
          goto LAB_0098dded;
          _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe077ce);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-paytxfee",&local_561);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_562);
          ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
          (*chain->_vptr_Chain[0x1e])(chain);
          CFeeRate::ToString_abi_cxx11_
                    (&local_498,(CFeeRate *)&stack0xfffffffffffffa90,
                     (FeeEstimateMode *)&stack0xfffffffffffffa8c);
          tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                    (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)"-paytxfee",
                     (char (*) [10])&criticalblock58,&local_498,&error->original);
LAB_0098e03f:
          bilingual_str::operator=(this_01,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          std::__cxx11::string::~string((string *)&local_498);
          goto LAB_0098e2f1;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock59,"paytxfee",(allocator<char> *)&local_498);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&max_aps_fee,"-paytxfee",(allocator<char> *)&stack0xfffffffffffffa90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"",(allocator<char> *)&stack0xfffffffffffffa8c);
        ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
        common::AmountErrMsg(&local_98,(string *)&criticalblock59,(string *)&criticalblock58);
        goto LAB_0098ea65;
      }
LAB_0098dded:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-maxtxfee",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock59,"-maxtxfee",(allocator<char> *)&max_aps_fee);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
        ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                            (string *)&criticalblock58);
        oVar23 = ParseMoney(&local_98.original);
        pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&criticalblock58);
        std::__cxx11::string::~string((string *)&criticalblock59);
        if (pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock59,"maxtxfee",(allocator<char> *)&local_498);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-maxtxfee",(allocator<char> *)&stack0xfffffffffffffa90)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"",(allocator<char> *)&stack0xfffffffffffffa8c);
          ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
          common::AmountErrMsg(&local_98,(string *)&criticalblock59,(string *)&criticalblock58);
          goto LAB_0098ea65;
        }
        if (100000000 <
            pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._M_value) {
          _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe07813);
          tinyformat::format<char[10]>
                    (&local_98,(bilingual_str *)&criticalblock59,(char (*) [10])"-maxtxfee");
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
        }
        if (chain != (Chain *)0x0) {
          if (pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged == false) {
            if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
              std::__throw_bad_optional_access();
            }
            goto LAB_0098f727;
          }
          CFeeRate::CFeeRate((CFeeRate *)&local_98,(CAmount *)&pay_tx_fee,1000);
          iVar7 = (*chain->_vptr_Chain[0x1e])(chain);
          if ((long)local_98.original._M_dataplus._M_p < CONCAT44(extraout_var_00,iVar7)) {
            _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe0785f);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&max_aps_fee,"-maxtxfee",&local_561);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_562);
            ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
            (*chain->_vptr_Chain[0x1e])(chain);
            CFeeRate::ToString_abi_cxx11_
                      (&local_498,(CFeeRate *)&stack0xfffffffffffffa90,
                       (FeeEstimateMode *)&stack0xfffffffffffffa8c);
            tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                      (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)"-maxtxfee",
                       (char (*) [10])&criticalblock58,&local_498,&error->original);
            goto LAB_0098e03f;
          }
        }
        if (pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged == false) {
          if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
            std::__throw_bad_optional_access();
          }
          goto LAB_0098f727;
        }
        (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_default_max_tx_fee =
             (CAmount)pay_tx_fee.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-consolidatefeerate",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::IsArgSet(this_00,&local_98.original);
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock59,"-consolidatefeerate",(allocator<char> *)&max_aps_fee)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock58,"",(allocator<char> *)&local_118);
        ArgsManager::GetArg(&local_98.original,this_00,(string *)&criticalblock59,
                            (string *)&criticalblock58);
        oVar23 = ParseMoney(&local_98.original);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&criticalblock58);
        std::__cxx11::string::~string((string *)&criticalblock59);
        if (((undefined1  [16])
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock59,"consolidatefeerate",(allocator<char> *)&local_498);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_aps_fee,"-consolidatefeerate",(allocator<char> *)&pay_tx_fee);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"",(allocator<char> *)&stack0xfffffffffffffa90);
          ArgsManager::GetArg((string *)&criticalblock58,this_00,&max_aps_fee,&local_118);
          common::AmountErrMsg(&local_98,(string *)&criticalblock59,(string *)&criticalblock58);
          goto LAB_0098ea65;
        }
        ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_consolidate_feerate).nSatoshisPerK =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
      }
      if ((chain != (Chain *)0x0) &&
         (iVar7 = (*chain->_vptr_Chain[0x1e])(chain), 1000000 < CONCAT44(extraout_var_01,iVar7))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&max_aps_fee,"-minrelaytxfee",(allocator<char> *)&local_118);
        common::AmountHighWarn(&local_518,&max_aps_fee);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_538," ",(allocator<char> *)&local_498);
        original_04._M_string_length = (size_type)this_01;
        original_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
        original_04.field_2._M_allocated_capacity = (size_type)this;
        original_04.field_2._8_4_ = (int)wallet_creation_flags;
        original_04.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
        Untranslated((bilingual_str *)&criticalblock59,original_04);
        lhs_09.original._M_string_length = (size_type)this_01;
        lhs_09.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
        lhs_09.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_09.original.field_2._8_4_ = (int)wallet_creation_flags;
        lhs_09.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
        lhs_09.translated._M_dataplus._M_p = (pointer)chain_00;
        lhs_09.translated._M_string_length = lVar10;
        lhs_09.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
        lhs_09.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
        lhs_09.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
        ::operator+(&local_4d8,lhs_09,&local_518);
        _((bilingual_str *)&criticalblock58,(ConstevalStringLiteral)0xe078e0);
        lhs_10.original._M_string_length = (size_type)this_01;
        lhs_10.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
        lhs_10.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_10.original.field_2._8_4_ = (int)wallet_creation_flags;
        lhs_10.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
        lhs_10.translated._M_dataplus._M_p = (pointer)chain_00;
        lhs_10.translated._M_string_length = lVar10;
        lhs_10.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
        lhs_10.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
        lhs_10.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
        ::operator+(&local_98,lhs_10,&local_4d8);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (warnings,&local_98);
        bilingual_str::~bilingual_str(&local_98);
        bilingual_str::~bilingual_str((bilingual_str *)&criticalblock58);
        bilingual_str::~bilingual_str(&local_4d8);
        bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
        std::__cxx11::string::~string(local_538);
        bilingual_str::~bilingual_str(&local_518);
        std::__cxx11::string::~string((string *)&max_aps_fee);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-txconfirmtarget",(allocator<char> *)&criticalblock59);
      iVar15 = ArgsManager::GetIntArg(this_00,&local_98.original,6);
      (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_confirm_target = (uint)iVar15;
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-spendzeroconfchange",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::GetBoolArg(this_00,&local_98.original,true);
      (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_spend_zero_conf_change = bVar5;
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"-walletrbf",(allocator<char> *)&criticalblock59);
      bVar5 = ArgsManager::GetBoolArg(this_00,&local_98.original,true);
      (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_signal_rbf = bVar5;
      std::__cxx11::string::~string((string *)&local_98);
      peVar21 = walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      lVar16 = std::chrono::_V2::steady_clock::now();
      local_98.original._M_dataplus._M_p = (pointer)((lVar16 - lVar10) / 1000000);
      WalletLogPrintf<long>(peVar21,(ConstevalFormatString<1U>)0xe0791e,(long *)&local_98);
      TopUpKeyPool(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,0);
      GetAllScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&local_98,
                 walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      bVar5 = false;
      for (uVar18 = local_98.original.field_2._8_8_; rescan_required = (undefined1)uVar20,
          (size_type *)uVar18 != &local_98.original._M_string_length;
          uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18)) {
        peVar17 = (element_type *)(**(code **)(**(long **)(uVar18 + 0x20) + 0x98))();
        if (!(bool)(bVar5 & (long)peVar21 <= (long)peVar17)) {
          bVar5 = true;
          peVar21 = peVar17;
        }
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&local_98);
      if ((bVar5) &&
         ((long)peVar21 <
          ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_birth_time).super___atomic_base<long>._M_i)) {
        LOCK();
        ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_birth_time).super___atomic_base<long>._M_i = (__int_type_conflict3)peVar21;
        UNLOCK();
      }
      pCVar11 = this;
      if ((chain_00 == (Chain *)0x0) ||
         (bVar5 = AttachChain(&walletInstance,chain_00,(bool)rescan_required,this_01,
                              (vector<bilingual_str,_std::allocator<bilingual_str>_> *)args_1),
         bVar5)) {
        this = pCVar11;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock59,
                   &(walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->cs_wallet,"walletInstance->cs_wallet",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                   ,0xc9a,false);
        peVar21 = walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"-walletbroadcast",(allocator<char> *)&criticalblock58);
        bVar5 = ArgsManager::GetBoolArg(this_00,&local_98.original,true);
        peVar21->fBroadcastTransactions = bVar5;
        std::__cxx11::string::~string((string *)&local_98);
        peVar21 = walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        uVar8 = GetKeyPoolSize(walletInstance.
                               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
        local_98.original._M_dataplus._M_p._0_4_ = uVar8;
        WalletLogPrintf<unsigned_int>(peVar21,(ConstevalFormatString<1U>)0xe07942,(uint *)&local_98)
        ;
        local_98.original._M_dataplus._M_p =
             (pointer)((walletInstance.
                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      mapWallet)._M_h._M_element_count;
        WalletLogPrintf<unsigned_long>
                  (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ConstevalFormatString<1U>)0xe0795a,(unsigned_long *)&local_98);
        local_98.original._M_dataplus._M_p =
             (pointer)((walletInstance.
                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      m_address_book)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        WalletLogPrintf<unsigned_long>
                  (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ConstevalFormatString<1U>)0xe07971,(unsigned_long *)&local_98);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock59.super_unique_lock);
        _Var2 = walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_WalletStorage)._vptr_WalletStorage =
             (_func_int **)
             walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->super_Notifications)._vptr_Notifications = (_func_int **)_Var2._M_pi;
        walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        goto LAB_0098cdb5;
      }
      pHVar1 = ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_chain_notifications_handler)._M_t.
               super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
               ._M_t.
               super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
               .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
      ((walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_chain_notifications_handler)._M_t.
      super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
      super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
      super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl = (Handler *)0x0;
      if (pHVar1 != (Handler *)0x0) {
        (*pHVar1->_vptr_Handler[1])();
      }
      goto LAB_0098cdb2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"-maxapsfee",(allocator<char> *)&criticalblock58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock59,"",(allocator<char> *)&local_118);
    ArgsManager::GetArg(&max_aps_fee,this_00,&local_98.original,(string *)&criticalblock59);
    std::__cxx11::string::~string((string *)&criticalblock59);
    std::__cxx11::string::~string((string *)&local_98);
    bVar5 = std::operator==(&max_aps_fee,"-1");
    if (bVar5) {
      _Var14._M_value = -1;
LAB_0098d4d4:
      (walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_max_aps_fee = (CAmount)_Var14;
      std::__cxx11::string::~string((string *)&max_aps_fee);
      goto LAB_0098d4ed;
    }
    oVar23 = ParseMoney(&max_aps_fee);
    _Var14._M_value =
         oVar23.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    if (((undefined1  [16])
         oVar23.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (10000 < _Var14._M_value) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"-maxapsfee",(allocator<char> *)&local_498);
        common::AmountHighWarn(&local_278,&local_118);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_298," ",(allocator<char> *)&pay_tx_fee);
        original_03._M_string_length = (size_type)this_01;
        original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
        original_03.field_2._M_allocated_capacity = (size_type)this;
        original_03.field_2._8_4_ = (int)wallet_creation_flags;
        original_03.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
        Untranslated((bilingual_str *)&criticalblock59,original_03);
        lhs_07.original._M_string_length = (size_type)this_01;
        lhs_07.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
        lhs_07.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_07.original.field_2._8_4_ = (int)wallet_creation_flags;
        lhs_07.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
        lhs_07.translated._M_dataplus._M_p = (pointer)chain_00;
        lhs_07.translated._M_string_length = lVar10;
        lhs_07.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
        lhs_07.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
        lhs_07.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
        ::operator+(&local_238,lhs_07,&local_278);
        _((bilingual_str *)&criticalblock58,(ConstevalStringLiteral)0xe07619);
        lhs_08.original._M_string_length = (size_type)this_01;
        lhs_08.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa58;
        lhs_08.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_08.original.field_2._8_4_ = (int)wallet_creation_flags;
        lhs_08.original.field_2._12_4_ = (int)(wallet_creation_flags >> 0x20);
        lhs_08.translated._M_dataplus._M_p = (pointer)chain_00;
        lhs_08.translated._M_string_length = lVar10;
        lhs_08.translated.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
        lhs_08.translated.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
        lhs_08.translated.field_2._8_8_ = in_stack_fffffffffffffa90.nSatoshisPerK;
        ::operator+(&local_98,lhs_08,&local_238);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (warnings,&local_98);
        bilingual_str::~bilingual_str(&local_98);
        bilingual_str::~bilingual_str((bilingual_str *)&criticalblock58);
        bilingual_str::~bilingual_str(&local_238);
        bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
        std::__cxx11::string::~string(local_298);
        bilingual_str::~bilingual_str(&local_278);
        std::__cxx11::string::~string((string *)&local_118);
      }
      goto LAB_0098d4d4;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock59,"maxapsfee",(allocator<char> *)&criticalblock58);
    common::AmountErrMsg(&local_98,(string *)&criticalblock59,&max_aps_fee);
    bilingual_str::operator=(this_01,&local_98);
    bilingual_str::~bilingual_str(&local_98);
    std::__cxx11::string::~string((string *)&criticalblock59);
    (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
    (this->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
    std::__cxx11::string::~string((string *)&max_aps_fee);
    goto LAB_0098cdb5;
  case TOO_NEW:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe072a7);
    tinyformat::format<std::__cxx11::string,char[13]>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bitcoin Core",
               (char (*) [13])args_1);
    break;
  case UNKNOWN_DESCRIPTOR:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe073c5);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  default:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe074f1);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  case UNEXPECTED_LEGACY_ENTRY:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe0745e);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  case CORRUPT:
    _((bilingual_str *)&criticalblock59,(ConstevalStringLiteral)0xe07213);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&criticalblock59,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  }
  bilingual_str::operator=(this_01,&local_98);
  bilingual_str::~bilingual_str(&local_98);
LAB_0098cd9d:
  bilingual_str::~bilingual_str((bilingual_str *)&criticalblock59);
LAB_0098cdb2:
  (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
  (this->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
LAB_0098cdb5:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&walletInstance.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_58);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
    sVar22.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar22.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<wallet::CWallet>)
           sVar22.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_0098f727:
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> CWallet::Create(WalletContext& context, const std::string& name, std::unique_ptr<WalletDatabase> database, uint64_t wallet_creation_flags, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    interfaces::Chain* chain = context.chain;
    ArgsManager& args = *Assert(context.args);
    const std::string& walletFile = database->Filename();

    const auto start{SteadyClock::now()};
    // TODO: Can't use std::make_shared because we need a custom deleter but
    // should be possible to use std::allocate_shared.
    std::shared_ptr<CWallet> walletInstance(new CWallet(chain, name, std::move(database)), FlushAndDeleteWallet);
    walletInstance->m_keypool_size = std::max(args.GetIntArg("-keypool", DEFAULT_KEYPOOL_SIZE), int64_t{1});
    walletInstance->m_notify_tx_changed_script = args.GetArg("-walletnotify", "");

    // Load wallet
    bool rescan_required = false;
    DBErrors nLoadWalletRet = walletInstance->LoadWallet();
    if (nLoadWalletRet != DBErrors::LOAD_OK) {
        if (nLoadWalletRet == DBErrors::CORRUPT) {
            error = strprintf(_("Error loading %s: Wallet corrupted"), walletFile);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::NONCRITICAL_ERROR)
        {
            warnings.push_back(strprintf(_("Error reading %s! All keys read correctly, but transaction data"
                                           " or address metadata may be missing or incorrect."),
                walletFile));
        }
        else if (nLoadWalletRet == DBErrors::TOO_NEW) {
            error = strprintf(_("Error loading %s: Wallet requires newer version of %s"), walletFile, PACKAGE_NAME);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED) {
            error = strprintf(_("Error loading %s: External signer wallet being loaded without external signer support compiled"), walletFile);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::NEED_REWRITE)
        {
            error = strprintf(_("Wallet needed to be rewritten: restart %s to complete"), PACKAGE_NAME);
            return nullptr;
        } else if (nLoadWalletRet == DBErrors::NEED_RESCAN) {
            warnings.push_back(strprintf(_("Error reading %s! Transaction data may be missing or incorrect."
                                           " Rescanning wallet."), walletFile));
            rescan_required = true;
        } else if (nLoadWalletRet == DBErrors::UNKNOWN_DESCRIPTOR) {
            error = strprintf(_("Unrecognized descriptor found. Loading wallet %s\n\n"
                                "The wallet might had been created on a newer version.\n"
                                "Please try running the latest software version.\n"), walletFile);
            return nullptr;
        } else if (nLoadWalletRet == DBErrors::UNEXPECTED_LEGACY_ENTRY) {
            error = strprintf(_("Unexpected legacy entry in descriptor wallet found. Loading wallet %s\n\n"
                                "The wallet might have been tampered with or created with malicious intent.\n"), walletFile);
            return nullptr;
        } else {
            error = strprintf(_("Error loading %s"), walletFile);
            return nullptr;
        }
    }

    // This wallet is in its first run if there are no ScriptPubKeyMans and it isn't blank or no privkeys
    const bool fFirstRun = walletInstance->m_spk_managers.empty() &&
                     !walletInstance->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS) &&
                     !walletInstance->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET);
    if (fFirstRun)
    {
        // ensure this wallet.dat can only be opened by clients supporting HD with chain split and expects no default key
        walletInstance->SetMinVersion(FEATURE_LATEST);

        walletInstance->InitWalletFlags(wallet_creation_flags);

        // Only create LegacyScriptPubKeyMan when not descriptor wallet
        if (!walletInstance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
            walletInstance->SetupLegacyScriptPubKeyMan();
        }

        if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) || !(wallet_creation_flags & (WALLET_FLAG_DISABLE_PRIVATE_KEYS | WALLET_FLAG_BLANK_WALLET))) {
            LOCK(walletInstance->cs_wallet);
            if (walletInstance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                walletInstance->SetupDescriptorScriptPubKeyMans();
                // SetupDescriptorScriptPubKeyMans already calls SetupGeneration for us so we don't need to call SetupGeneration separately
            } else {
                // Legacy wallets need SetupGeneration here.
                for (auto spk_man : walletInstance->GetActiveScriptPubKeyMans()) {
                    if (!spk_man->SetupGeneration()) {
                        error = _("Unable to generate initial keys");
                        return nullptr;
                    }
                }
            }
        }

        if (chain) {
            walletInstance->chainStateFlushed(ChainstateRole::NORMAL, chain->getTipLocator());
        }
    } else if (wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS) {
        // Make it impossible to disable private keys after creation
        error = strprintf(_("Error loading %s: Private keys can only be disabled during creation"), walletFile);
        return nullptr;
    } else if (walletInstance->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        for (auto spk_man : walletInstance->GetActiveScriptPubKeyMans()) {
            if (spk_man->HavePrivateKeys()) {
                warnings.push_back(strprintf(_("Warning: Private keys detected in wallet {%s} with disabled private keys"), walletFile));
                break;
            }
        }
    }

    if (!args.GetArg("-addresstype", "").empty()) {
        std::optional<OutputType> parsed = ParseOutputType(args.GetArg("-addresstype", ""));
        if (!parsed) {
            error = strprintf(_("Unknown address type '%s'"), args.GetArg("-addresstype", ""));
            return nullptr;
        }
        walletInstance->m_default_address_type = parsed.value();
    }

    if (!args.GetArg("-changetype", "").empty()) {
        std::optional<OutputType> parsed = ParseOutputType(args.GetArg("-changetype", ""));
        if (!parsed) {
            error = strprintf(_("Unknown change type '%s'"), args.GetArg("-changetype", ""));
            return nullptr;
        }
        walletInstance->m_default_change_type = parsed.value();
    }

    if (args.IsArgSet("-mintxfee")) {
        std::optional<CAmount> min_tx_fee = ParseMoney(args.GetArg("-mintxfee", ""));
        if (!min_tx_fee) {
            error = AmountErrMsg("mintxfee", args.GetArg("-mintxfee", ""));
            return nullptr;
        } else if (min_tx_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-mintxfee") + Untranslated(" ") +
                               _("This is the minimum transaction fee you pay on every transaction."));
        }

        walletInstance->m_min_fee = CFeeRate{min_tx_fee.value()};
    }

    if (args.IsArgSet("-maxapsfee")) {
        const std::string max_aps_fee{args.GetArg("-maxapsfee", "")};
        if (max_aps_fee == "-1") {
            walletInstance->m_max_aps_fee = -1;
        } else if (std::optional<CAmount> max_fee = ParseMoney(max_aps_fee)) {
            if (max_fee.value() > HIGH_APS_FEE) {
                warnings.push_back(AmountHighWarn("-maxapsfee") + Untranslated(" ") +
                                  _("This is the maximum transaction fee you pay (in addition to the normal fee) to prioritize partial spend avoidance over regular coin selection."));
            }
            walletInstance->m_max_aps_fee = max_fee.value();
        } else {
            error = AmountErrMsg("maxapsfee", max_aps_fee);
            return nullptr;
        }
    }

    if (args.IsArgSet("-fallbackfee")) {
        std::optional<CAmount> fallback_fee = ParseMoney(args.GetArg("-fallbackfee", ""));
        if (!fallback_fee) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s'"), "-fallbackfee", args.GetArg("-fallbackfee", ""));
            return nullptr;
        } else if (fallback_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-fallbackfee") + Untranslated(" ") +
                               _("This is the transaction fee you may pay when fee estimates are not available."));
        }
        walletInstance->m_fallback_fee = CFeeRate{fallback_fee.value()};
    }

    // Disable fallback fee in case value was set to 0, enable if non-null value
    walletInstance->m_allow_fallback_fee = walletInstance->m_fallback_fee.GetFeePerK() != 0;

    if (args.IsArgSet("-discardfee")) {
        std::optional<CAmount> discard_fee = ParseMoney(args.GetArg("-discardfee", ""));
        if (!discard_fee) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s'"), "-discardfee", args.GetArg("-discardfee", ""));
            return nullptr;
        } else if (discard_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-discardfee") + Untranslated(" ") +
                               _("This is the transaction fee you may discard if change is smaller than dust at this level"));
        }
        walletInstance->m_discard_rate = CFeeRate{discard_fee.value()};
    }

    if (args.IsArgSet("-paytxfee")) {
        std::optional<CAmount> pay_tx_fee = ParseMoney(args.GetArg("-paytxfee", ""));
        if (!pay_tx_fee) {
            error = AmountErrMsg("paytxfee", args.GetArg("-paytxfee", ""));
            return nullptr;
        } else if (pay_tx_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-paytxfee") + Untranslated(" ") +
                               _("This is the transaction fee you will pay if you send a transaction."));
        }

        walletInstance->m_pay_tx_fee = CFeeRate{pay_tx_fee.value(), 1000};

        if (chain && walletInstance->m_pay_tx_fee < chain->relayMinFee()) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s' (must be at least %s)"),
                "-paytxfee", args.GetArg("-paytxfee", ""), chain->relayMinFee().ToString());
            return nullptr;
        }
    }

    if (args.IsArgSet("-maxtxfee")) {
        std::optional<CAmount> max_fee = ParseMoney(args.GetArg("-maxtxfee", ""));
        if (!max_fee) {
            error = AmountErrMsg("maxtxfee", args.GetArg("-maxtxfee", ""));
            return nullptr;
        } else if (max_fee.value() > HIGH_MAX_TX_FEE) {
            warnings.push_back(strprintf(_("%s is set very high! Fees this large could be paid on a single transaction."), "-maxtxfee"));
        }

        if (chain && CFeeRate{max_fee.value(), 1000} < chain->relayMinFee()) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s' (must be at least the minrelay fee of %s to prevent stuck transactions)"),
                "-maxtxfee", args.GetArg("-maxtxfee", ""), chain->relayMinFee().ToString());
            return nullptr;
        }

        walletInstance->m_default_max_tx_fee = max_fee.value();
    }

    if (args.IsArgSet("-consolidatefeerate")) {
        if (std::optional<CAmount> consolidate_feerate = ParseMoney(args.GetArg("-consolidatefeerate", ""))) {
            walletInstance->m_consolidate_feerate = CFeeRate(*consolidate_feerate);
        } else {
            error = AmountErrMsg("consolidatefeerate", args.GetArg("-consolidatefeerate", ""));
            return nullptr;
        }
    }

    if (chain && chain->relayMinFee().GetFeePerK() > HIGH_TX_FEE_PER_KB) {
        warnings.push_back(AmountHighWarn("-minrelaytxfee") + Untranslated(" ") +
                           _("The wallet will avoid paying less than the minimum relay fee."));
    }

    walletInstance->m_confirm_target = args.GetIntArg("-txconfirmtarget", DEFAULT_TX_CONFIRM_TARGET);
    walletInstance->m_spend_zero_conf_change = args.GetBoolArg("-spendzeroconfchange", DEFAULT_SPEND_ZEROCONF_CHANGE);
    walletInstance->m_signal_rbf = args.GetBoolArg("-walletrbf", DEFAULT_WALLET_RBF);

    walletInstance->WalletLogPrintf("Wallet completed loading in %15dms\n", Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));

    // Try to top up keypool. No-op if the wallet is locked.
    walletInstance->TopUpKeyPool();

    // Cache the first key time
    std::optional<int64_t> time_first_key;
    for (auto spk_man : walletInstance->GetAllScriptPubKeyMans()) {
        int64_t time = spk_man->GetTimeFirstKey();
        if (!time_first_key || time < *time_first_key) time_first_key = time;
    }
    if (time_first_key) walletInstance->MaybeUpdateBirthTime(*time_first_key);

    if (chain && !AttachChain(walletInstance, *chain, rescan_required, error, warnings)) {
        walletInstance->m_chain_notifications_handler.reset(); // Reset this pointer so that the wallet will actually be unloaded
        return nullptr;
    }

    {
        LOCK(walletInstance->cs_wallet);
        walletInstance->SetBroadcastTransactions(args.GetBoolArg("-walletbroadcast", DEFAULT_WALLETBROADCAST));
        walletInstance->WalletLogPrintf("setKeyPool.size() = %u\n",      walletInstance->GetKeyPoolSize());
        walletInstance->WalletLogPrintf("mapWallet.size() = %u\n",       walletInstance->mapWallet.size());
        walletInstance->WalletLogPrintf("m_address_book.size() = %u\n",  walletInstance->m_address_book.size());
    }

    return walletInstance;
}